

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

int list_size_aux(List *ls,int level)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    if (1000 < level) {
      abort();
    }
    if (ls == (List *)0x0) break;
    level = level + 1;
    iVar1 = list_size_aux(ls->car,level);
    ls = ls->cdr;
    iVar2 = iVar2 + iVar1 + 1;
  }
  return iVar2;
}

Assistant:

static int
list_size_aux (const List *ls, int level)
{
  if (level > 1000)  /* avoid infinite death */
    abort ();
  if (ls == NULL)  /* Recursion base case. */
    return 0;
  return (1 + list_size_aux (ls->car, level + 1)
	  + list_size_aux (ls->cdr, level + 1));
}